

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.h
# Opt level: O1

SimulationDecPOMDPDiscrete * __thiscall
SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
          (SimulationDecPOMDPDiscrete *this,
          vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *agents)

{
  AgentFullyObservable *pAVar1;
  pointer ppAVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  long *in_RDX;
  uint uVar6;
  Index IVar7;
  int iVar8;
  pointer ppAVar9;
  double *pdVar10;
  ulong uVar11;
  Index sI;
  Index joI;
  SimulationDecPOMDPDiscrete *local_c0;
  ulong local_b8;
  long *local_b0;
  int local_a4;
  double specialR;
  double sumR;
  double r;
  long *local_88 [2];
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  
  local_b0 = in_RDX;
  SimulationResult::SimulationResult
            ((SimulationResult *)this,
             *(int *)&agents[1].
                      super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
             *(int *)((long)&(agents->
                             super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 4),
             *(int *)&(agents->
                      super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  if (0 < *(int *)&(agents->
                   super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
    iVar8 = 0;
    local_c0 = this;
    do {
      local_b8 = (ulong)(local_b0[1] - *local_b0) >> 3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&aIs,(long)(int)local_b8,(allocator_type *)&local_68);
      r = 0.0;
      sumR = 0.0;
      pAVar1 = agents[1].
               super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
               _M_impl.super__Vector_impl_data._M_start[0x66];
      sI = (**(code **)(*(long *)(pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8)) + 0x160))
                     (pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8));
      if (*(char *)&(agents->
                    super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Simulation::RunSimulation set initial state to ",0x2f);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pAVar1 = agents[1].
                 super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[0x66];
        plVar5 = (long *)(**(code **)(*(long *)(pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8)) + 0x38)
                         )(pAVar1 + *(long *)(*(long *)pAVar1 + -0xb8),sI);
        (**(code **)(*plVar5 + 0x18))(&local_68,plVar5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_68,local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," (avg reward so far ",0x14);
        poVar4 = std::ostream::_M_insert<double>(*(double *)this);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
      }
      if (0 < (int)(uint)local_b8) {
        uVar6 = (uint)local_b8 & 0x7fffffff;
        uVar11 = 0;
        do {
          plVar5 = *(long **)(*local_b0 + uVar11 * 8);
          (**(code **)(*(long *)((long)plVar5 + *(long *)(*plVar5 + -0x18)) + 0x30))
                    ((long)plVar5 + *(long *)(*plVar5 + -0x18));
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
      }
      joI = 0x7fffffff;
      local_a4 = iVar8;
      if (agents[1].
          super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        uVar6 = (uint)local_b8;
        pdVar10 = (double *)0x7fffffff;
        ppAVar9 = (pointer)0x0;
        IVar7 = 0x7fffffff;
        do {
          specialR = 0.0;
          if (0 < (int)(uint)local_b8) {
            uVar11 = 0;
            do {
              uVar3 = SimulationDecPOMDPDiscrete::GetAction
                                ((vector *)agents,(uint)local_b0,(uint)uVar11,(uint)pdVar10,r,joI,
                                 IVar7,sI,pdVar10);
              aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] = uVar3;
              uVar11 = uVar11 + 1;
            } while ((uVar6 & 0x7fffffff) != uVar11);
          }
          ppAVar2 = agents[1].
                    super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = (**(code **)(*ppAVar2 + 0x48))(ppAVar2,&aIs);
          IVar7 = joI;
          pdVar10 = (double *)(ulong)uVar3;
          SimulationDecPOMDPDiscrete::Step
                    ((uint)agents,uVar3,(uint *)ppAVar9,&sI,(double *)&joI,&r,specialR);
          ppAVar9 = (pointer)(ulong)((int)ppAVar9 + 1);
        } while (ppAVar9 < agents[1].
                           super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      this = local_c0;
      SimulationResult::AddReward(sumR);
      iVar8 = local_a4;
      if (*(char *)&agents[1].
                    super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
        local_88[0] = local_78;
        ppAVar9 = agents[2].
                  super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,ppAVar9,
                   (long)agents[2].
                         super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish + (long)ppAVar9);
        SimulationResult::Save(this,local_88);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
      }
      if (aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < *(int *)&(agents->
                              super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish);
  }
  return this;
}

Assistant:

SimulationResult
    RunSimulations(const std::vector<A*> &agents) const
    {
        SimulationResult result(_m_horizon,GetRandomSeed(),GetNrRuns());

        // Run the simulations
        int i;
        for(i=0;i<GetNrRuns();i++)
        {
            Index jaI,sI,joI,prevJoI,prevJaI,prevSI;
            int nr=agents.size(),i;
            std::vector<Index> aIs(nr);

            unsigned int h;
            double r=0,sumR=0,specialR;

            sI = _m_pu->GetDPOMDPD()->SampleInitialState();

            if(GetVerbose())
                std::cout << "Simulation::RunSimulation set initial state to " 
                     << sI << " "
                     << _m_pu->GetDPOMDPD()->GetState(sI)->SoftPrintBrief()
                     << " (avg reward so far " << result.GetAvgReward()
                          << ")" << std::endl;

            for(i=0;i<nr;++i)
                agents[i]->ResetEpisode();

            joI=INT_MAX;
            jaI=INT_MAX;
            prevJoI=INT_MAX;
            prevJaI=INT_MAX;
            prevSI=INT_MAX;
            for(h=0;h<_m_horizon;h++)
            {
                PreActHook(agents,jaI,joI,r,prevJoI,sI,prevJaI,prevSI,h);
                specialR=0;
                // get the action for each particular agent
                for(i=0;i<nr;++i)
                    aIs[i]=GetAction(agents,i,jaI,joI,r,prevJoI,sI,prevJaI, specialR);
                jaI=_m_pu->IndividualToJointActionIndices(aIs);

                prevJoI=joI;
                prevJaI=jaI;
                prevSI=sI;
                Step(jaI, h, sI, joI, r, sumR, specialR);
            }
            
            result.AddReward(sumR);

            if(_m_saveIntermediateResults)
                result.Save(_m_intermediateResultsFilename);
        }
        
        return(result);
    }